

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::SPxShellsort<int,soplex::Compare<double>>
               (int *keys,int end,Compare<double> *compare,int start)

{
  long lVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  
  lVar8 = 2;
  do {
    iVar3 = SPxShellsort<int,_soplex::Compare<double>_>::incs[lVar8];
    lVar1 = (long)iVar3 + (long)start;
    if ((int)lVar1 <= end) {
      pdVar5 = compare->weight;
      lVar10 = lVar1;
      iVar7 = start;
      do {
        iVar4 = keys[lVar10];
        iVar9 = (int)lVar10;
        if (lVar1 <= lVar10) {
          dVar2 = pdVar5[iVar4];
          iVar6 = iVar7;
          do {
            if (pdVar5[keys[iVar6]] <= dVar2) {
              iVar9 = iVar6 + iVar3;
              goto LAB_0022dd4e;
            }
            keys[iVar3 + iVar6] = keys[iVar6];
            iVar9 = iVar6 - iVar3;
            bVar11 = (int)lVar1 <= iVar6;
            iVar6 = iVar9;
          } while (bVar11);
          iVar9 = iVar9 + iVar3;
        }
LAB_0022dd4e:
        keys[iVar9] = iVar4;
        lVar10 = lVar10 + 1;
        iVar7 = iVar7 + 1;
      } while (end + 1 != (int)lVar10);
    }
    bVar11 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar11) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}